

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void * __thiscall AllocatorState::alloc(AllocatorState *this,size_t size)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  void **val1;
  char *expr2;
  internal *this_00;
  void **in_R8;
  void *unaff_R12;
  char *expr1;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  void *local_40;
  void *result;
  
  lVar3 = random();
  if ((double)((int)lVar3 +
              ((int)(SUB168(SEXT816(lVar3) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
              (SUB164(SEXT816(lVar3) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100) <
      this->memalign_fraction_ * 100.0) {
    auVar6._8_4_ = (int)(size >> 0x20);
    auVar6._0_8_ = size;
    auVar6._12_4_ = 0x45300000;
    bVar5 = false;
    uVar4 = 0;
    do {
      lVar3 = random();
      expr1 = (char *)(1L << ((byte)(lVar3 % 0x12) & 0x3f));
      bVar1 = true;
      if (2 < (ulong)(lVar3 % 0x12)) {
        auVar7._8_4_ = (int)((ulong)expr1 >> 0x20);
        auVar7._0_8_ = expr1;
        auVar7._12_4_ = 0x45300000;
        if ((size < 8) ||
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)expr1) - 4503599627370496.0) <
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * 6.0)) {
          local_40 = (void *)0x1234;
          this_00 = (internal *)&result;
          result = (void *)size;
          (*noopt_helper)(this_00);
          iVar2 = posix_memalign(&local_40,(size_t)expr1,(size_t)result);
          result = (void *)CONCAT44(result._4_4_,iVar2);
          (*noopt_helper)(this_00);
          val1 = (void **)((ulong)result & 0xffffffff);
          if (((int)result != 0) && ((int)result != 0xc)) {
            alloc();
            if (*val1 == *in_R8) {
              testing::internal::CmpHelperOpFailure<void*,void*>
                        (this_00,expr1,expr2,val1,in_R8,"!=");
            }
            else {
              testing::AssertionSuccess();
            }
            return this_00;
          }
          bVar1 = false;
          unaff_R12 = local_40;
          if ((int)result != 0) {
            unaff_R12 = (void *)0x0;
          }
        }
      }
      if (!bVar1) break;
      bVar5 = 3 < uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 5);
    if (!bVar5) {
      return unaff_R12;
    }
  }
  result = malloc(size);
  (*noopt_helper)(&result);
  return result;
}

Assistant:

void* alloc(size_t size) {
    if (Uniform(100) < memalign_fraction_ * 100) {
      // Try a few times to find a reasonable alignment, or fall back on malloc.
      for (int i = 0; i < 5; i++) {
        size_t alignment = size_t{1} << Uniform(FLAGS_lg_max_memalign);
        if (alignment >= sizeof(intptr_t) &&
            (size < sizeof(intptr_t) ||
             alignment < FLAGS_memalign_max_alignment_ratio * size)) {
          void *result = reinterpret_cast<void*>(static_cast<intptr_t>(0x1234));
          int err = PosixMemalign(&result, alignment, size);
          if (err != 0) {
            CHECK_EQ(err, ENOMEM);
          }
          return err == 0 ? result : nullptr;
        }
      }
    }
    return noopt(malloc(size));
  }